

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O1

void write_colormap(j_decompress_ptr cinfo,bmp_dest_ptr dest,int map_colors,int map_entry_size)

{
  uint uVar1;
  JSAMPARRAY ppJVar2;
  FILE *__stream;
  jpeg_error_mgr *pjVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  ppJVar2 = cinfo->colormap;
  __stream = (FILE *)(dest->pub).output_file;
  if (ppJVar2 == (JSAMPARRAY)0x0) {
    iVar5 = 0;
    do {
      putc(iVar5,__stream);
      putc(iVar5,__stream);
      putc(iVar5,__stream);
      if (map_entry_size == 4) {
        putc(0,__stream);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x100);
    uVar6 = 0x100;
  }
  else {
    uVar1 = cinfo->actual_number_of_colors;
    if (cinfo->out_color_components == 3) {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          putc((uint)ppJVar2[2][uVar6],__stream);
          putc((uint)ppJVar2[1][uVar6],__stream);
          putc((uint)(*ppJVar2)[uVar6],__stream);
          if (map_entry_size == 4) {
            putc(0,__stream);
          }
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
        goto LAB_0011a107;
      }
    }
    else if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        putc((uint)(*ppJVar2)[uVar6],__stream);
        putc((uint)(*ppJVar2)[uVar6],__stream);
        putc((uint)(*ppJVar2)[uVar6],__stream);
        if (map_entry_size == 4) {
          putc(0,__stream);
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      goto LAB_0011a107;
    }
    uVar6 = 0;
  }
LAB_0011a107:
  iVar5 = (int)uVar6;
  if (map_colors < iVar5) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x400;
    (pjVar3->msg_parm).i[0] = iVar5;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar4 = map_colors - iVar5;
  if (iVar4 != 0 && iVar5 <= map_colors) {
    do {
      putc(0,__stream);
      putc(0,__stream);
      putc(0,__stream);
      if (map_entry_size == 4) {
        putc(0,__stream);
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

LOCAL(void)
write_colormap(j_decompress_ptr cinfo, bmp_dest_ptr dest, int map_colors,
               int map_entry_size)
{
  JSAMPARRAY colormap = cinfo->colormap;
  int num_colors = cinfo->actual_number_of_colors;
  FILE *outfile = dest->pub.output_file;
  int i;

  if (colormap != NULL) {
    if (cinfo->out_color_components == 3) {
      /* Normal case with RGB colormap */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[2][i], outfile);
        putc(colormap[1][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    } else {
      /* Grayscale colormap (only happens with grayscale quantization) */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    }
  } else {
    /* If no colormap, must be grayscale data.  Generate a linear "map". */
    for (i = 0; i < 256; i++) {
      putc(i, outfile);
      putc(i, outfile);
      putc(i, outfile);
      if (map_entry_size == 4)
        putc(0, outfile);
    }
  }
  /* Pad colormap with zeros to ensure specified number of colormap entries */
  if (i > map_colors)
    ERREXIT1(cinfo, JERR_TOO_MANY_COLORS, i);
  for (; i < map_colors; i++) {
    putc(0, outfile);
    putc(0, outfile);
    putc(0, outfile);
    if (map_entry_size == 4)
      putc(0, outfile);
  }
}